

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall
duckdb::AttachedDatabase::AttachedDatabase
          (AttachedDatabase *this,DatabaseInstance *db,Catalog *catalog_p,string *name_p,
          string *file_path_p,AttachOptions *options)

{
  string *l1;
  _Head_base<0UL,_duckdb::Catalog_*,_false> _Var1;
  _Head_base<0UL,_duckdb::StorageManager_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TransactionManager_*,_false> _Var3;
  _Alloc_hider _Var4;
  bool bVar5;
  BinderException *this_00;
  __node_base *p_Var6;
  bool read_only;
  AttachedDatabase *local_c0;
  string local_b8;
  unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>,_true>
  *local_98;
  unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>,_true> *local_90;
  unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true> *local_88;
  AttachOptions *local_80;
  string *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_78 = file_path_p;
  ::std::__cxx11::string::string((string *)&local_50,(string *)name_p);
  CatalogEntry::CatalogEntry(&this->super_CatalogEntry,DATABASE_ENTRY,catalog_p,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_CatalogEntry)._vptr_CatalogEntry = (_func_int **)&PTR__AttachedDatabase_027bb1c8;
  this->db = db;
  local_90 = &this->storage;
  local_88 = &this->catalog;
  (this->storage).
  super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>.
  super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl = (StorageManager *)0x0;
  (this->catalog).super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
  super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)0x0;
  (this->transaction_manager).
  super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
  .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
       (TransactionManager *)0x0;
  (this->parent_catalog).ptr = catalog_p;
  (this->storage_extension).ptr = (StorageExtension *)0x0;
  local_98 = &this->transaction_manager;
  this->is_initial_database = false;
  this->is_closed = false;
  this->type = (uint)(options->access_mode == READ_ONLY);
  p_Var6 = &(options->options)._M_h._M_before_begin;
  local_c0 = this;
  local_80 = options;
  do {
    do {
      do {
        do {
          p_Var6 = p_Var6->_M_nxt;
          if (p_Var6 == (__node_base *)0x0) {
            make_uniq<duckdb::DuckCatalog,duckdb::AttachedDatabase&>((duckdb *)&local_b8,local_c0);
            _Var4._M_p = local_b8._M_dataplus._M_p;
            local_b8._M_dataplus._M_p = (pointer)0x0;
            _Var1._M_head_impl =
                 (local_88->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
                 super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
                 super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl;
            (local_88->super_unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>).
            _M_t.super___uniq_ptr_impl<duckdb::Catalog,_std::default_delete<duckdb::Catalog>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::Catalog_*,_std::default_delete<duckdb::Catalog>_>.
            super__Head_base<0UL,_duckdb::Catalog_*,_false>._M_head_impl = (Catalog *)_Var4._M_p;
            if (_Var1._M_head_impl != (Catalog *)0x0) {
              (**(code **)((long)(_Var1._M_head_impl)->_vptr_Catalog + 8))();
              if ((StorageManager *)local_b8._M_dataplus._M_p != (StorageManager *)0x0) {
                (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
              }
            }
            read_only = local_80->access_mode == READ_ONLY;
            make_uniq<duckdb::SingleFileStorageManager,duckdb::AttachedDatabase&,std::__cxx11::string,bool&>
                      ((duckdb *)&local_b8,local_c0,local_78,&read_only);
            _Var4._M_p = local_b8._M_dataplus._M_p;
            local_b8._M_dataplus._M_p = (pointer)0x0;
            _Var2._M_head_impl =
                 (local_90->
                 super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
                 .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl;
            (local_90->
            super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>).
            _M_t.
            super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
            .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl =
                 (StorageManager *)_Var4._M_p;
            if (_Var2._M_head_impl != (StorageManager *)0x0) {
              (**(code **)((long)(_Var2._M_head_impl)->_vptr_StorageManager + 8))();
              if ((TransactionManager *)local_b8._M_dataplus._M_p != (TransactionManager *)0x0) {
                (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
              }
            }
            make_uniq<duckdb::DuckTransactionManager,duckdb::AttachedDatabase&>
                      ((duckdb *)&local_b8,local_c0);
            _Var4._M_p = local_b8._M_dataplus._M_p;
            local_b8._M_dataplus._M_p = (pointer)0x0;
            _Var3._M_head_impl =
                 (local_98->
                 super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
                 .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl;
            (local_98->
            super_unique_ptr<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::TransactionManager,_std::default_delete<duckdb::TransactionManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
            .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
                 (TransactionManager *)_Var4._M_p;
            if (_Var3._M_head_impl != (TransactionManager *)0x0) {
              (**(code **)((long)(_Var3._M_head_impl)->_vptr_TransactionManager + 8))();
              if ((long *)local_b8._M_dataplus._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_b8._M_dataplus._M_p + 8))();
              }
            }
            (local_c0->super_CatalogEntry).internal = true;
            return;
          }
          ::std::__cxx11::string::string((string *)&local_b8,"block_size",(allocator *)&read_only);
          l1 = (string *)(p_Var6 + 1);
          bVar5 = StringUtil::CIEquals(l1,&local_b8);
          ::std::__cxx11::string::~string((string *)&local_b8);
        } while (bVar5);
        ::std::__cxx11::string::string((string *)&local_b8,"encryption_key",(allocator *)&read_only)
        ;
        bVar5 = StringUtil::CIEquals(l1,&local_b8);
        ::std::__cxx11::string::~string((string *)&local_b8);
      } while (bVar5);
      ::std::__cxx11::string::string((string *)&local_b8,"row_group_size",(allocator *)&read_only);
      bVar5 = StringUtil::CIEquals(l1,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
    } while (bVar5);
    ::std::__cxx11::string::string((string *)&local_b8,"storage_version",(allocator *)&read_only);
    bVar5 = StringUtil::CIEquals(l1,&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
  } while (bVar5);
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b8,"Unrecognized option for attach \"%s\"",(allocator *)&read_only);
  ::std::__cxx11::string::string((string *)&local_70,(string *)l1);
  BinderException::BinderException<std::__cxx11::string>(this_00,(string *)&local_b8,&local_70);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

AttachedDatabase::AttachedDatabase(DatabaseInstance &db, Catalog &catalog_p, string name_p, string file_path_p,
                                   const AttachOptions &options)
    : CatalogEntry(CatalogType::DATABASE_ENTRY, catalog_p, std::move(name_p)), db(db), parent_catalog(&catalog_p) {

	if (options.access_mode == AccessMode::READ_ONLY) {
		type = AttachedDatabaseType::READ_ONLY_DATABASE;
	} else {
		type = AttachedDatabaseType::READ_WRITE_DATABASE;
	}
	for (auto &entry : options.options) {
		if (StringUtil::CIEquals(entry.first, "block_size")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "encryption_key")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "row_group_size")) {
			continue;
		}
		if (StringUtil::CIEquals(entry.first, "storage_version")) {
			continue;
		}
		throw BinderException("Unrecognized option for attach \"%s\"", entry.first);
	}
	// We create the storage after the catalog to guarantee we allow extensions to instantiate the DuckCatalog.
	catalog = make_uniq<DuckCatalog>(*this);
	auto read_only = options.access_mode == AccessMode::READ_ONLY;
	storage = make_uniq<SingleFileStorageManager>(*this, std::move(file_path_p), read_only);
	transaction_manager = make_uniq<DuckTransactionManager>(*this);
	internal = true;
}